

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<double_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,approx *rhs)

{
  double dVar1;
  double dVar2;
  lest *this_00;
  approx *in_R8;
  double dVar3;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  this_00 = *(lest **)this;
  local_48 = *(double *)this_00;
  uStack_40 = 0;
  local_38 = rhs->magnitude_;
  uStack_30 = 0;
  dVar1 = rhs->epsilon_;
  dVar2 = rhs->scale_;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"!=","");
  to_string<double,lest::approx>(&local_88,this_00,(double *)local_68,(string *)rhs,in_R8);
  dVar3 = ABS(local_38);
  if (ABS(local_48) <= ABS(local_38)) {
    dVar3 = ABS(local_48);
  }
  __return_storage_ptr__->passed = dVar1 * (dVar2 + dVar3) <= ABS(local_48 - local_38);
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }